

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

bool_t objIsOperable2(void *obj)

{
  bool_t bVar1;
  uint uVar2;
  
  bVar1 = memIsValid(obj,0x18);
  uVar2 = 0;
  if (bVar1 != 0) {
    bVar1 = memIsValid(obj,*obj);
    if ((bVar1 != 0) && (*(ulong *)((long)obj + 0x10) <= *(ulong *)((long)obj + 8))) {
      uVar2 = (uint)(*(ulong *)((long)obj + 8) * 8 + 0x18 <= *obj);
    }
  }
  return uVar2;
}

Assistant:

bool_t objIsOperable2(const void* obj)
{
	return memIsValid(obj, sizeof(obj_hdr_t)) &&
		memIsValid(obj, objKeep(obj)) &&
		objOCount(obj) <= objPCount(obj) &&
		sizeof(obj_hdr_t) + sizeof(void*) * objPCount(obj) <= objKeep(obj);
}